

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImGuiID IVar1;
  ImVector<unsigned_int> *this_00;
  size_t sVar2;
  char *in_RDX;
  long in_RSI;
  ImDrawList *in_RDI;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ImRect *in_stack_ffffffffffffff70;
  ImVec2 **str;
  ImVec4 **str_00;
  ImGuiWindowTempData *in_stack_ffffffffffffff90;
  ImGuiWindow *this_01;
  ImDrawListSharedData *shared_data;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c [2];
  char *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ImVec2::ImVec2((ImVec2 *)&in_RDI->IdxBuffer);
  ImVec2::ImVec2((ImVec2 *)&(in_RDI->IdxBuffer).Data);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->VtxBuffer);
  ImVec2::ImVec2((ImVec2 *)&(in_RDI->VtxBuffer).Data);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->Flags);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->_Data);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->_OwnerName);
  ImVec2::ImVec2((ImVec2 *)&(in_RDI->_ClipRectStack).Capacity);
  ImVec2::ImVec2((ImVec2 *)((long)&(in_RDI->_ClipRectStack).Data + 4));
  ImVec2::ImVec2((ImVec2 *)&(in_RDI->_TextureIdStack).Capacity);
  ImVec2::ImVec2((ImVec2 *)((long)&(in_RDI->_TextureIdStack).Data + 4));
  ImVec2::ImVec2((ImVec2 *)&(in_RDI->_Path).Capacity);
  ImVec2::ImVec2((ImVec2 *)((long)&(in_RDI->_Path).Data + 4));
  ImVec2::ImVec2((ImVec2 *)&(in_RDI->_Splitter)._Channels.Data);
  ImVec2::ImVec2((ImVec2 *)&in_RDI->_FringeScale);
  shared_data = (ImDrawListSharedData *)(in_RDI + 1);
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)shared_data);
  ImGuiWindowTempData::ImGuiWindowTempData(in_stack_ffffffffffffff90);
  ImRect::ImRect(in_stack_ffffffffffffff70);
  ImRect::ImRect(in_stack_ffffffffffffff70);
  ImRect::ImRect(in_stack_ffffffffffffff70);
  ImRect::ImRect(in_stack_ffffffffffffff70);
  ImRect::ImRect(in_stack_ffffffffffffff70);
  ImRect::ImRect(in_stack_ffffffffffffff70);
  ImRect::ImRect(in_stack_ffffffffffffff70);
  ImVec2ih::ImVec2ih((ImVec2ih *)&in_RDI[2]._CmdHeader.VtxOffset);
  ImVec2ih::ImVec2ih((ImVec2ih *)&in_RDI[2]._CmdHeader.field_0x1c);
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x117a71);
  ImVector<ImGuiOldColumns>::ImVector((ImVector<ImGuiOldColumns> *)(in_RDI + 3));
  this_01 = (ImGuiWindow *)&in_RDI[3].VtxBuffer;
  ImDrawList::ImDrawList(in_RDI,shared_data);
  str_00 = &in_RDI[4]._ClipRectStack.Data;
  str = &in_RDI[4]._Path.Data;
  do {
    ImRect::ImRect(in_stack_ffffffffffffff70);
    str_00 = str_00 + 2;
  } while (str_00 != (ImVec4 **)str);
  memset(in_RDI,0,0x3b0);
  this_00 = (ImVector<unsigned_int> *)ImStrdup((char *)str);
  *(ImVector<unsigned_int> **)&in_RDI->CmdBuffer = this_00;
  sVar2 = strlen(local_18);
  *(int *)&in_RDI->_IdxWritePtr = (int)sVar2 + 1;
  IVar1 = ImHashStr(local_18,0,0);
  *(ImGuiID *)&(in_RDI->CmdBuffer).Data = IVar1;
  ImVector<unsigned_int>::push_back
            (this_00,(uint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  IVar1 = GetID(this_01,(char *)str_00,(char *)str);
  *(ImGuiID *)((long)&in_RDI->_IdxWritePtr + 4) = IVar1;
  ImVec2::ImVec2(local_2c,3.4028235e+38,3.4028235e+38);
  *(ImVec2 *)&(in_RDI->_TextureIdStack).Capacity = local_2c[0];
  ImVec2::ImVec2(&local_34,0.5,0.5);
  *(ImVec2 *)((long)&(in_RDI->_TextureIdStack).Data + 4) = local_34;
  *(undefined1 *)((long)&(in_RDI->_Splitter)._Current + 1) = 0xff;
  *(undefined1 *)&(in_RDI->_Splitter)._Current = 0xff;
  (in_RDI->_Splitter)._Count = -1;
  *(undefined1 *)((long)&(in_RDI->_Splitter)._Channels.Capacity + 2) = 0xf;
  *(undefined1 *)((long)&(in_RDI->_Splitter)._Channels.Capacity + 1) = 0xf;
  *(undefined1 *)&(in_RDI->_Splitter)._Channels.Capacity = 0xf;
  ImVec2::ImVec2(&local_3c,3.4028235e+38,3.4028235e+38);
  in_RDI->_FringeScale = local_3c.x;
  *(float *)&in_RDI->field_0xc4 = local_3c.y;
  (in_RDI->_Splitter)._Channels.Data = *(ImDrawChannel **)&in_RDI->_FringeScale;
  in_RDI[2]._Splitter._Current = -1;
  in_RDI[2]._Splitter._Count = -0x40800000;
  in_RDI[3].IdxBuffer.Size = 0x3f800000;
  in_RDI[3].IdxBuffer.Capacity = -1;
  in_RDI[3].IdxBuffer.Data = (unsigned_short *)&in_RDI[3].VtxBuffer;
  *(long *)(in_RDI[3].IdxBuffer.Data + 0x1c) = local_10 + 0x3c20;
  *(undefined8 *)(in_RDI[3].IdxBuffer.Data + 0x20) = *(undefined8 *)&in_RDI->CmdBuffer;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name) : DrawListInst(NULL)
{
    memset(this, 0, sizeof(*this));
    Name = ImStrdup(name);
    NameBufLen = (int)strlen(name) + 1;
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoPosLastDirection = ImGuiDir_None;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);
    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;
    DrawList = &DrawListInst;
    DrawList->_Data = &context->DrawListSharedData;
    DrawList->_OwnerName = Name;
}